

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

floatx80 subFloatx80Sigs(floatx80 a,floatx80 b,flag zSign,float_status *status)

{
  int iVar1;
  undefined1 auVar2 [12];
  ulong uVar3;
  uint64_t zSig0;
  ulong uVar4;
  byte bVar5;
  uint zExp;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  floatx80 fVar11;
  
  uVar6 = b.low;
  uVar7 = a._8_8_;
  uVar3 = a.low;
  uVar10 = a._8_4_ & 0x7fff;
  zExp = b._8_4_ & 0x7fff;
  iVar9 = uVar10 - zExp;
  if (iVar9 == 0 || uVar10 < zExp) {
    if (iVar9 < 0) {
      if (zExp == 0x7fff) {
        if (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0) {
          uVar7 = (ulong)((uint)(byte)~zSign << 0xf | 0x7fff);
          uVar3 = 0x8000000000000000;
          goto LAB_00d02dc3;
        }
        goto LAB_00d02c78;
      }
      iVar1 = -(uint)(((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0);
      iVar8 = iVar1 - iVar9;
      if (iVar8 == 0) goto LAB_00d02d96;
      bVar5 = -((char)iVar1 - (char)iVar9) & 0x3f;
      if (iVar8 < 0x40) {
        uVar4 = uVar3 >> ((byte)iVar8 & 0x3f);
        uVar7 = uVar3 << bVar5;
      }
      else if (iVar8 == 0x40) {
        uVar4 = 0;
        uVar7 = uVar3;
      }
      else {
        if (iVar8 < 0x80) {
          uVar7 = (ulong)(uVar3 << bVar5 != 0) | uVar3 >> ((byte)iVar8 & 0x3f);
        }
        else {
          uVar7 = (ulong)(uVar3 != 0);
        }
        uVar4 = 0;
      }
    }
    else {
      if (((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0) {
        uVar10 = 1;
        zExp = 1;
      }
      else if (uVar10 == 0x7fff) {
        if (((uVar6 | uVar3) & 0x7fffffffffffffff) == 0) {
          status->float_exception_flags = status->float_exception_flags | 1;
          uVar7 = CONCAT62(a._10_6_,0xffff);
          uVar3 = 0xc000000000000000;
          goto LAB_00d02dc3;
        }
        goto LAB_00d02c78;
      }
      if (uVar6 < uVar3) goto LAB_00d02d4e;
      if (uVar6 <= uVar3) {
        uVar7 = (ulong)(status->float_rounding_mode == '\x01') << 0xf;
        uVar3 = 0;
        goto LAB_00d02dc3;
      }
LAB_00d02d96:
      uVar7 = 0;
      uVar4 = uVar3;
    }
    zSig0 = (uVar6 - uVar4) + -1 + (ulong)(uVar7 == 0);
    zSign = zSign ^ 1;
LAB_00d02daa:
    fVar11 = normalizeRoundAndPackFloatx80_tricore
                       (status->floatx80_rounding_precision,zSign,zExp,zSig0,-uVar7,status);
    auVar2 = fVar11._0_12_;
  }
  else {
    if (uVar10 != 0x7fff) {
      iVar9 = iVar9 - (uint)(((undefined1  [16])b & (undefined1  [16])0x7fff) ==
                            (undefined1  [16])0x0);
      if (iVar9 == 0) {
LAB_00d02d4e:
        uVar7 = 0;
        uVar4 = uVar6;
      }
      else {
        bVar5 = (byte)iVar9;
        if (iVar9 < 0x40) {
          uVar4 = uVar6 >> (bVar5 & 0x3f);
          uVar7 = uVar6 << (-bVar5 & 0x3f);
        }
        else if (iVar9 == 0x40) {
          uVar4 = 0;
          uVar7 = uVar6;
        }
        else {
          if (iVar9 < 0x80) {
            uVar7 = (ulong)(uVar6 << (-bVar5 & 0x3f) != 0) | uVar6 >> (bVar5 & 0x3f);
          }
          else {
            uVar7 = (ulong)(uVar6 != 0);
          }
          uVar4 = 0;
        }
      }
      zSig0 = (uVar3 - uVar4) + -1 + (ulong)(uVar7 == 0);
      zExp = uVar10;
      goto LAB_00d02daa;
    }
    if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0)
    goto LAB_00d02dc3;
LAB_00d02c78:
    fVar11 = propagateFloatx80NaN_tricore(a,b,status);
    auVar2 = fVar11._0_12_;
  }
  uVar3 = auVar2._0_8_;
  uVar7 = (ulong)auVar2._8_4_;
LAB_00d02dc3:
  fVar11._8_8_ = uVar7 & 0xffffffff;
  fVar11.low = uVar3;
  return fVar11;
}

Assistant:

static floatx80 subFloatx80Sigs(floatx80 a, floatx80 b, flag zSign,
                                float_status *status)
{
    int32_t aExp, bExp, zExp;
    uint64_t aSig, bSig, zSig0, zSig1;
    int32_t expDiff;

    aSig = extractFloatx80Frac( a );
    aExp = extractFloatx80Exp( a );
    bSig = extractFloatx80Frac( b );
    bExp = extractFloatx80Exp( b );
    expDiff = aExp - bExp;
    if ( 0 < expDiff ) goto aExpBigger;
    if ( expDiff < 0 ) goto bExpBigger;
    if ( aExp == 0x7FFF ) {
        if ( (uint64_t) ( ( aSig | bSig )<<1 ) ) {
            return propagateFloatx80NaN(a, b, status);
        }
        float_raise(float_flag_invalid, status);
        return floatx80_default_nan(status);
    }
    if ( aExp == 0 ) {
        aExp = 1;
        bExp = 1;
    }
    zSig1 = 0;
    if ( bSig < aSig ) goto aBigger;
    if ( aSig < bSig ) goto bBigger;
    return packFloatx80(status->float_rounding_mode == float_round_down, 0, 0);
 bExpBigger:
    if ( bExp == 0x7FFF ) {
        if ((uint64_t)(bSig << 1)) {
            return propagateFloatx80NaN(a, b, status);
        }
        return packFloatx80(zSign ^ 1, floatx80_infinity_high,
                            floatx80_infinity_low);
    }
    if ( aExp == 0 ) ++expDiff;
    shift128RightJamming( aSig, 0, - expDiff, &aSig, &zSig1 );
 bBigger:
    sub128( bSig, 0, aSig, zSig1, &zSig0, &zSig1 );
    zExp = bExp;
    zSign ^= 1;
    goto normalizeRoundAndPack;
 aExpBigger:
    if ( aExp == 0x7FFF ) {
        if ((uint64_t)(aSig << 1)) {
            return propagateFloatx80NaN(a, b, status);
        }
        return a;
    }
    if ( bExp == 0 ) --expDiff;
    shift128RightJamming( bSig, 0, expDiff, &bSig, &zSig1 );
 aBigger:
    sub128( aSig, 0, bSig, zSig1, &zSig0, &zSig1 );
    zExp = aExp;
 normalizeRoundAndPack:
    return normalizeRoundAndPackFloatx80(status->floatx80_rounding_precision,
                                         zSign, zExp, zSig0, zSig1, status);
}